

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# inlined_vector.h
# Opt level: O0

reference __thiscall
absl::InlinedVector<S2ShapeIndexCell_const*,6ul,std::allocator<S2ShapeIndexCell_const*>>::
emplace_back<S2ShapeIndexCell_const*>
          (InlinedVector<S2ShapeIndexCell_const*,6ul,std::allocator<S2ShapeIndexCell_const*>> *this,
          S2ShapeIndexCell **args)

{
  bool bVar1;
  size_type sVar2;
  size_type sVar3;
  Tag *pTVar4;
  pointer local_30;
  pointer space;
  size_type s;
  S2ShapeIndexCell **args_local;
  InlinedVector<const_S2ShapeIndexCell_*,_6UL,_std::allocator<const_S2ShapeIndexCell_*>_>
  *this_local;
  
  sVar2 = InlinedVector<const_S2ShapeIndexCell_*,_6UL,_std::allocator<const_S2ShapeIndexCell_*>_>::
          size((InlinedVector<const_S2ShapeIndexCell_*,_6UL,_std::allocator<const_S2ShapeIndexCell_*>_>
                *)this);
  sVar3 = InlinedVector<const_S2ShapeIndexCell_*,_6UL,_std::allocator<const_S2ShapeIndexCell_*>_>::
          capacity((InlinedVector<const_S2ShapeIndexCell_*,_6UL,_std::allocator<const_S2ShapeIndexCell_*>_>
                    *)this);
  if (sVar3 < sVar2) {
    __assert_fail("s <= capacity()",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/figroc[P]s2geometry/src/s2/third_party/absl/container/inlined_vector.h"
                  ,0x217,
                  "reference absl::InlinedVector<const S2ShapeIndexCell *, 6>::emplace_back(Args &&...) [T = const S2ShapeIndexCell *, N = 6, A = std::allocator<const S2ShapeIndexCell *>, Args = <const S2ShapeIndexCell *>]"
                 );
  }
  sVar3 = InlinedVector<const_S2ShapeIndexCell_*,_6UL,_std::allocator<const_S2ShapeIndexCell_*>_>::
          capacity((InlinedVector<const_S2ShapeIndexCell_*,_6UL,_std::allocator<const_S2ShapeIndexCell_*>_>
                    *)this);
  if (sVar2 == sVar3) {
    this_local = (InlinedVector<const_S2ShapeIndexCell_*,_6UL,_std::allocator<const_S2ShapeIndexCell_*>_>
                  *)GrowAndEmplaceBack<S2ShapeIndexCell_const*>(this,args);
  }
  else {
    sVar3 = InlinedVector<const_S2ShapeIndexCell_*,_6UL,_std::allocator<const_S2ShapeIndexCell_*>_>
            ::capacity((InlinedVector<const_S2ShapeIndexCell_*,_6UL,_std::allocator<const_S2ShapeIndexCell_*>_>
                        *)this);
    if (sVar3 <= sVar2) {
      __assert_fail("s < capacity()",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/figroc[P]s2geometry/src/s2/third_party/absl/container/inlined_vector.h"
                    ,0x21b,
                    "reference absl::InlinedVector<const S2ShapeIndexCell *, 6>::emplace_back(Args &&...) [T = const S2ShapeIndexCell *, N = 6, A = std::allocator<const S2ShapeIndexCell *>, Args = <const S2ShapeIndexCell *>]"
                   );
    }
    bVar1 = InlinedVector<const_S2ShapeIndexCell_*,_6UL,_std::allocator<const_S2ShapeIndexCell_*>_>
            ::allocated((InlinedVector<const_S2ShapeIndexCell_*,_6UL,_std::allocator<const_S2ShapeIndexCell_*>_>
                         *)this);
    if (bVar1) {
      pTVar4 = InlinedVector<const_S2ShapeIndexCell_*,_6UL,_std::allocator<const_S2ShapeIndexCell_*>_>
               ::tag((InlinedVector<const_S2ShapeIndexCell_*,_6UL,_std::allocator<const_S2ShapeIndexCell_*>_>
                      *)this);
      InlinedVector<const_S2ShapeIndexCell_*,_6UL,_std::allocator<const_S2ShapeIndexCell_*>_>::Tag::
      set_allocated_size(pTVar4,sVar2 + 1);
      local_30 = InlinedVector<const_S2ShapeIndexCell_*,_6UL,_std::allocator<const_S2ShapeIndexCell_*>_>
                 ::allocated_space((InlinedVector<const_S2ShapeIndexCell_*,_6UL,_std::allocator<const_S2ShapeIndexCell_*>_>
                                    *)this);
    }
    else {
      pTVar4 = InlinedVector<const_S2ShapeIndexCell_*,_6UL,_std::allocator<const_S2ShapeIndexCell_*>_>
               ::tag((InlinedVector<const_S2ShapeIndexCell_*,_6UL,_std::allocator<const_S2ShapeIndexCell_*>_>
                      *)this);
      InlinedVector<const_S2ShapeIndexCell_*,_6UL,_std::allocator<const_S2ShapeIndexCell_*>_>::Tag::
      set_inline_size(pTVar4,sVar2 + 1);
      local_30 = InlinedVector<const_S2ShapeIndexCell_*,_6UL,_std::allocator<const_S2ShapeIndexCell_*>_>
                 ::inlined_space((InlinedVector<const_S2ShapeIndexCell_*,_6UL,_std::allocator<const_S2ShapeIndexCell_*>_>
                                  *)this);
    }
    this_local = (InlinedVector<const_S2ShapeIndexCell_*,_6UL,_std::allocator<const_S2ShapeIndexCell_*>_>
                  *)Construct<S2ShapeIndexCell_const*>(this,local_30 + sVar2,args);
  }
  return (reference)this_local;
}

Assistant:

reference emplace_back(Args&&... args) {
    size_type s = size();
    assert(s <= capacity());
    if (ABSL_PREDICT_FALSE(s == capacity())) {
      return GrowAndEmplaceBack(std::forward<Args>(args)...);
    }
    assert(s < capacity());

    pointer space;
    if (allocated()) {
      tag().set_allocated_size(s + 1);
      space = allocated_space();
    } else {
      tag().set_inline_size(s + 1);
      space = inlined_space();
    }
    return Construct(space + s, std::forward<Args>(args)...);
  }